

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O1

TRef lj_opt_fwd_alen(jit_State *J)

{
  ushort uVar1;
  ushort uVar2;
  IRIns *pIVar3;
  int iVar4;
  AliasRet AVar5;
  TRef TVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ushort uVar10;
  bool bVar11;
  
  uVar1 = (J->fold).ins.field_0.op1;
  uVar10 = J->chain[0x4b];
  while (uVar8 = (uint)uVar10, uVar9 = (uint)uVar1, uVar1 < uVar8) {
    pIVar3 = (J->cur).ir;
    uVar7 = (ulong)*(ushort *)((long)pIVar3 + (ulong)pIVar3[uVar8].field_0.op1 * 8 + 2);
    if (*(char *)((long)pIVar3 + uVar7 * 8 + 5) == '\x1e') {
      uVar7 = (ulong)pIVar3[uVar7].field_0.op1;
    }
    uVar9 = uVar8;
    if ((*(byte *)((long)pIVar3 + uVar7 * 8 + 4) & 0x1f) == 0xe) break;
    uVar10 = *(ushort *)((long)pIVar3 + (ulong)uVar8 * 8 + 6);
  }
  uVar10 = J->chain[0x49];
  if (uVar9 < uVar10) {
    pIVar3 = (J->cur).ir;
    do {
      if (pIVar3[uVar10].field_0.op1 == uVar1) {
        iVar4 = fwd_aa_tab_clear(J,(uint)uVar10,(uint)uVar1);
        if (iVar4 != 0) {
          uVar9 = (uint)J->chain[0x4a];
          goto LAB_0011cd50;
        }
        iVar4 = 5;
        goto LAB_0011cdee;
      }
      uVar10 = *(ushort *)((long)pIVar3 + (ulong)uVar10 * 8 + 6);
    } while (uVar9 < uVar10);
  }
  goto LAB_0011cdf8;
  while( true ) {
    uVar7 = (ulong)uVar9;
    if (uVar1 == pIVar3[pIVar3[pIVar3[uVar7].field_0.op1].field_0.op1].field_0.op1) {
      iVar4 = 8;
      if ((*(byte *)((long)pIVar3 + uVar7 * 8 + 4) & 0x1f) != 0) {
        uVar2 = *(ushort *)((long)pIVar3 + (ulong)pIVar3[uVar7].field_0.op1 * 8 + 2);
        uVar7 = (ulong)uVar2;
        if ((((*(char *)((long)pIVar3 + uVar7 * 8 + 5) == ')') &&
             (pIVar3[uVar7].field_0.op1 == uVar10)) &&
            (uVar7 = (ulong)*(ushort *)((long)pIVar3 + uVar7 * 8 + 2),
            *(char *)((long)pIVar3 + uVar7 * 8 + 5) == '\x17')) && (pIVar3[uVar7].field_1.op12 == 1)
           ) {
          (J->fold).ins.field_0.op2 = uVar2;
        }
      }
      bVar11 = false;
    }
    else {
      AVar5 = aa_table(J,(uint)uVar1,
                       (uint)pIVar3[pIVar3[pIVar3[uVar7].field_0.op1].field_0.op1].field_0.op1);
      iVar4 = 0;
      bVar11 = AVar5 == ALIAS_NO;
      if (bVar11) {
        uVar9 = (uint)*(ushort *)((long)pIVar3 + uVar7 * 8 + 6);
      }
      else {
        iVar4 = 8;
      }
    }
    if (!bVar11) break;
LAB_0011cd50:
    if (uVar9 <= uVar10) {
      iVar4 = 1;
      break;
    }
  }
LAB_0011cdee:
  if ((iVar4 != 8) && (iVar4 != 5)) {
    return (TRef)uVar10;
  }
LAB_0011cdf8:
  TVar6 = lj_ir_emit(J);
  return TVar6;
}

Assistant:

TRef LJ_FASTCALL lj_opt_fwd_alen(jit_State *J)
{
  IRRef tab = fins->op1;  /* Table reference. */
  IRRef lim = tab;  /* Search limit. */
  IRRef ref;

  /* Search for conflicting HSTORE with numeric key. */
  ref = J->chain[IR_HSTORE];
  while (ref > lim) {
    IRIns *store = IR(ref);
    IRIns *href = IR(store->op1);
    IRIns *key = IR(href->op2);
    if (irt_isnum(key->o == IR_KSLOT ? IR(key->op1)->t : key->t)) {
      lim = ref;  /* Conflicting store found, limits search for ALEN. */
      break;
    }
    ref = store->prev;
  }

  /* Try to find a matching ALEN. */
  ref = J->chain[IR_ALEN];
  while (ref > lim) {
    /* CSE for ALEN only depends on the table, not the hint. */
    if (IR(ref)->op1 == tab) {
      IRRef sref;

      /* Search for aliasing table.clear. */
      if (!fwd_aa_tab_clear(J, ref, tab))
	break;

      /* Search for hint-forwarding or conflicting store. */
      sref = J->chain[IR_ASTORE];
      while (sref > ref) {
	IRIns *store = IR(sref);
	IRIns *aref = IR(store->op1);
	IRIns *fref = IR(aref->op1);
	if (tab == fref->op1) {  /* ASTORE to the same table. */
	  /* Detect t[#t+1] = x idiom for push. */
	  IRIns *idx = IR(aref->op2);
	  if (!irt_isnil(store->t) &&
	      idx->o == IR_ADD && idx->op1 == ref &&
	      IR(idx->op2)->o == IR_KINT && IR(idx->op2)->i == 1) {
	    /* Note: this requires an extra PHI check in loop unroll. */
	    fins->op2 = aref->op2;  /* Set ALEN hint. */
	  }
	  goto doemit;  /* Conflicting store, possibly giving a hint. */
	} else if (aa_table(J, tab, fref->op1) != ALIAS_NO) {
	  goto doemit;  /* Conflicting store. */
	}
	sref = store->prev;
      }

      return ref;  /* Plain ALEN forwarding. */
    }
    ref = IR(ref)->prev;
  }
doemit:
  return EMITFOLD;
}